

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Input::matchEnumScalar(Input *this,char *Str,bool param_2)

{
  bool bVar1;
  ret_type pSVar2;
  StringRef local_48;
  StringRef local_38;
  
  if (this->ScalarMatchFound != false) {
    return false;
  }
  pSVar2 = dyn_cast<llvm::yaml::Input::ScalarHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  if (pSVar2 != (ret_type)0x0) {
    local_48.Data = (pSVar2->_value).Data;
    local_48.Length = (pSVar2->_value).Length;
    StringRef::StringRef(&local_38,Str);
    bVar1 = StringRef::equals(&local_48,local_38);
    if (bVar1) {
      this->ScalarMatchFound = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool Input::matchEnumScalar(const char *Str, bool) {
  if (ScalarMatchFound)
    return false;
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    if (SN->value().equals(Str)) {
      ScalarMatchFound = true;
      return true;
    }
  }
  return false;
}